

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O2

void transpose2_8x8_avx2(__m256i *in,__m256i *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  __m256i u [16];
  __m256i t [16];
  undefined1 auStack_500 [32];
  undefined1 auStack_4e0 [32];
  undefined1 auStack_4c0 [64];
  undefined1 auStack_480 [32];
  undefined1 auStack_460 [32];
  undefined1 local_440 [320];
  undefined1 auStack_300 [64];
  undefined1 auStack_2c0 [64];
  undefined1 auStack_280 [32];
  undefined1 auStack_260 [32];
  undefined1 auStack_240 [568];
  
  for (lVar4 = 0x20; lVar4 != 0x120; lVar4 = lVar4 + 0x40) {
    auVar1 = *(undefined1 (*) [32])((long)in[-1] + lVar4);
    auVar2 = *(undefined1 (*) [32])((long)*in + lVar4);
    auVar3 = vpunpcklwd_avx2(auVar1,auVar2);
    *(undefined1 (*) [32])(auStack_260 + lVar4) = auVar3;
    auVar1 = vpunpckhwd_avx2(auVar1,auVar2);
    *(undefined1 (*) [32])(auStack_240 + lVar4) = auVar1;
  }
  for (lVar4 = 0xc0; lVar4 != 0x100; lVar4 = lVar4 + 0x20) {
    auVar1 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_300 + lVar4),
                             *(undefined1 (*) [32])(auStack_2c0 + lVar4));
    *(undefined1 (*) [32])(auStack_500 + lVar4) = auVar1;
    auVar1 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_300 + lVar4),
                             *(undefined1 (*) [32])(auStack_2c0 + lVar4));
    *(undefined1 (*) [32])(auStack_4c0 + lVar4) = auVar1;
    auVar1 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_280 + lVar4),
                             *(undefined1 (*) [32])(auStack_240 + lVar4));
    *(undefined1 (*) [32])(auStack_480 + lVar4) = auVar1;
    auVar1 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_280 + lVar4),
                             *(undefined1 (*) [32])(auStack_240 + lVar4));
    *(undefined1 (*) [32])(local_440 + lVar4) = auVar1;
  }
  for (lVar4 = 0xa0; lVar4 != 0x120; lVar4 = lVar4 + 0x40) {
    auVar1 = *(undefined1 (*) [32])(auStack_4e0 + lVar4);
    auVar2 = *(undefined1 (*) [32])(auStack_460 + lVar4);
    auVar3 = vunpcklpd_avx(auVar1,auVar2);
    *(undefined1 (*) [32])((long)out[-5] + lVar4) = auVar3;
    auVar1 = vunpckhpd_avx(auVar1,auVar2);
    *(undefined1 (*) [32])((long)out[-4] + lVar4) = auVar1;
    auVar1 = *(undefined1 (*) [32])(auStack_4c0 + lVar4);
    auVar2 = *(undefined1 (*) [32])(local_440 + lVar4);
    auVar3 = vpunpcklqdq_avx2(auVar1,auVar2);
    *(undefined1 (*) [32])((long)out[-1] + lVar4) = auVar3;
    auVar1 = vpunpckhqdq_avx2(auVar1,auVar2);
    *(undefined1 (*) [32])((long)*out + lVar4) = auVar1;
  }
  return;
}

Assistant:

static inline void transpose2_8x8_avx2(const __m256i *const in,
                                       __m256i *const out) {
  __m256i t[16], u[16];
  // (1st, 2nd) ==> (lo, hi)
  //   (0, 1)   ==>  (0, 1)
  //   (2, 3)   ==>  (2, 3)
  //   (4, 5)   ==>  (4, 5)
  //   (6, 7)   ==>  (6, 7)
  for (int i = 0; i < 4; i++) {
    t[2 * i] = _mm256_unpacklo_epi16(in[2 * i], in[2 * i + 1]);
    t[2 * i + 1] = _mm256_unpackhi_epi16(in[2 * i], in[2 * i + 1]);
  }

  // (1st, 2nd) ==> (lo, hi)
  //   (0, 2)   ==>  (0, 2)
  //   (1, 3)   ==>  (1, 3)
  //   (4, 6)   ==>  (4, 6)
  //   (5, 7)   ==>  (5, 7)
  for (int i = 0; i < 2; i++) {
    u[i] = _mm256_unpacklo_epi32(t[i], t[i + 2]);
    u[i + 2] = _mm256_unpackhi_epi32(t[i], t[i + 2]);

    u[i + 4] = _mm256_unpacklo_epi32(t[i + 4], t[i + 6]);
    u[i + 6] = _mm256_unpackhi_epi32(t[i + 4], t[i + 6]);
  }

  // (1st, 2nd) ==> (lo, hi)
  //   (0, 4)   ==>  (0, 1)
  //   (1, 5)   ==>  (4, 5)
  //   (2, 6)   ==>  (2, 3)
  //   (3, 7)   ==>  (6, 7)
  for (int i = 0; i < 2; i++) {
    out[2 * i] = _mm256_unpacklo_epi64(u[2 * i], u[2 * i + 4]);
    out[2 * i + 1] = _mm256_unpackhi_epi64(u[2 * i], u[2 * i + 4]);

    out[2 * i + 4] = _mm256_unpacklo_epi64(u[2 * i + 1], u[2 * i + 5]);
    out[2 * i + 5] = _mm256_unpackhi_epi64(u[2 * i + 1], u[2 * i + 5]);
  }
}